

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.cc
# Opt level: O0

void __thiscall re2c::Scanner::restore_state(Scanner *this,ScannerState *state)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  char *old_eof;
  char *old_top;
  char *old_lim;
  char *old_bot;
  ptrdiff_t diff;
  ScannerState *state_local;
  Scanner *this_local;
  
  lVar5 = (long)(this->super_ScannerState).bot - (long)state->bot;
  pcVar1 = (this->super_ScannerState).bot;
  pcVar2 = (this->super_ScannerState).lim;
  pcVar3 = (this->super_ScannerState).top;
  pcVar4 = (this->super_ScannerState).eof;
  ScannerState::operator=(&this->super_ScannerState,state);
  if (lVar5 != 0) {
    (this->super_ScannerState).tok = (this->super_ScannerState).tok + -lVar5;
    (this->super_ScannerState).ptr = (this->super_ScannerState).ptr + -lVar5;
    (this->super_ScannerState).cur = (this->super_ScannerState).cur + -lVar5;
    (this->super_ScannerState).pos = (this->super_ScannerState).pos + -lVar5;
    (this->super_ScannerState).ctx = (this->super_ScannerState).ctx + -lVar5;
    (this->super_ScannerState).bot = pcVar1;
    (this->super_ScannerState).lim = pcVar2;
    (this->super_ScannerState).top = pcVar3;
    (this->super_ScannerState).eof = pcVar4;
  }
  return;
}

Assistant:

void Scanner::restore_state(const ScannerState& state)
{
	ptrdiff_t diff = bot - state.bot;
	char *old_bot = bot;
	char *old_lim = lim;
	char *old_top = top;
	char *old_eof = eof;
	*(ScannerState*)this = state;
	if (diff)
	{
		tok -= diff;
		ptr -= diff;
		cur -= diff;
		pos -= diff;
		ctx -= diff;		
		bot = old_bot;
		lim = old_lim;
		top = old_top;
		eof = old_eof;
	}
}